

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strglob.c
# Opt level: O0

u32 duckdb_shell_sqlite3Utf8Read(uchar **pz)

{
  byte *pbVar1;
  uint c;
  uchar **pz_local;
  
  pbVar1 = *pz;
  *pz = pbVar1 + 1;
  c = (uint)*pbVar1;
  if (0xbf < c) {
    c = (uint)""[c - 0xc0];
    while ((**pz & 0xc0) == 0x80) {
      pbVar1 = *pz;
      *pz = pbVar1 + 1;
      c = c * 0x40 + (*pbVar1 & 0x3f);
    }
    if (((c < 0x80) || ((c & 0xfffff800) == 0xd800)) || ((c & 0xfffffffe) == 0xfffe)) {
      c = 0xfffd;
    }
  }
  return c;
}

Assistant:

u32 sqlite3Utf8Read(const unsigned char **pz /* Pointer to string from which to read char */
) {
	unsigned int c;

	/* Same as READ_UTF8() above but without the zTerm parameter.
	** For this routine, we assume the UTF8 string is always zero-terminated.
	*/
	c = *((*pz)++);
	if (c >= 0xc0) {
		c = sqlite3Utf8Trans1[c - 0xc0];
		while ((*(*pz) & 0xc0) == 0x80) {
			c = (c << 6) + (0x3f & *((*pz)++));
		}
		if (c < 0x80 || (c & 0xFFFFF800) == 0xD800 || (c & 0xFFFFFFFE) == 0xFFFE) {
			c = 0xFFFD;
		}
	}
	return c;
}